

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsvectorbase.h
# Opt level: O3

void __thiscall
soplex::
DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::allocMem(DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int n)

{
  undefined8 *puVar1;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar2;
  long lVar3;
  
  spx_alloc<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>*>
            (&this->theelem,n);
  if (0 < n) {
    lVar3 = 0;
    do {
      pNVar2 = this->theelem;
      *(undefined8 *)((long)(&(pNVar2->val).m_backend.data + 1) + lVar3 + 8) = 0x1000000000;
      puVar1 = (undefined8 *)((long)(pNVar2->val).m_backend.data._M_elems + lVar3);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)(pNVar2->val).m_backend.data._M_elems + lVar3 + 0x10);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)(pNVar2->val).m_backend.data._M_elems + lVar3 + 0x20);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)(pNVar2->val).m_backend.data._M_elems + lVar3 + 0x30);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)(pNVar2->val).m_backend.data._M_elems + lVar3 + 0x3d) = 0;
      *(undefined4 *)((long)(&pNVar2->val + 1) + lVar3) = 0;
      lVar3 = lVar3 + 0x54;
    } while ((ulong)(uint)n * 0x54 - lVar3 != 0);
  }
  (this->
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).m_elem = this->theelem;
  (this->
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).memused = 0;
  (this->
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).memsize = n;
  return;
}

Assistant:

void allocMem(int n)
   {
      spx_alloc(theelem, n);

      for(int i = 0; i < n; i++)
         new(&(theelem[i])) Nonzero<R>();

      SVectorBase<R>::setMem(n, theelem);
   }